

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty(void)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uv_loop_t *puVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uStack_2b0;
  int height;
  int width;
  uv_tty_t tty_in;
  uv_tty_t tty_out;
  
  uVar4 = uv_default_loop();
  iVar1 = open64("/dev/tty",0,0);
  if (iVar1 < 0) {
    pcVar9 = "Cannot open /dev/tty as read-only: %s\n";
  }
  else {
    iVar2 = open64("/dev/tty",1,0);
    if (-1 < iVar2) {
      iVar3 = uv_guess_handle(0xffffffffffffffff);
      if (iVar3 == 0) {
        iVar3 = uv_guess_handle(iVar1);
        if (iVar3 == 0xe) {
          iVar3 = uv_guess_handle(iVar2);
          if (iVar3 == 0xe) {
            uVar5 = uv_default_loop();
            iVar1 = uv_tty_init(uVar5,&tty_in,iVar1,1);
            if (iVar1 == 0) {
              iVar1 = uv_is_readable(&tty_in);
              if (iVar1 == 0) {
                pcVar9 = "uv_is_readable((uv_stream_t*) &tty_in)";
                uStack_2b0 = 99;
              }
              else {
                iVar1 = uv_is_writable(&tty_in);
                if (iVar1 == 0) {
                  uVar5 = uv_default_loop();
                  iVar1 = uv_tty_init(uVar5,&tty_out,iVar2,0);
                  if (iVar1 == 0) {
                    iVar1 = uv_is_readable(&tty_out);
                    if (iVar1 == 0) {
                      iVar1 = uv_is_writable(&tty_out);
                      if (iVar1 == 0) {
                        pcVar9 = "uv_is_writable((uv_stream_t*) &tty_out)";
                        uStack_2b0 = 0x69;
                      }
                      else {
                        iVar1 = uv_tty_get_winsize(&tty_out,&width,&height);
                        if (iVar1 == 0) {
                          printf("width=%d height=%d\n",(ulong)(uint)width,(ulong)(uint)height);
                          if (width == 0 && height == 0) {
                            puVar6 = (uv_loop_t *)uv_default_loop();
                            close_loop(puVar6);
                            uVar4 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar4);
                            if (iVar1 == 0) {
                              return 1;
                            }
                            pcVar9 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_2b0 = 0x73;
                          }
                          else if (width < 0xb) {
                            pcVar9 = "width > 10";
                            uStack_2b0 = 0x7b;
                          }
                          else if (height < 0xb) {
                            pcVar9 = "height > 10";
                            uStack_2b0 = 0x7c;
                          }
                          else {
                            iVar1 = uv_tty_set_mode(&tty_in,1);
                            if (iVar1 == 0) {
                              iVar1 = uv_tty_set_mode(&tty_in,0);
                              if (iVar1 == 0) {
                                piVar7 = __errno_location();
                                *piVar7 = 0;
                                iVar1 = uv_tty_reset_mode();
                                if (iVar1 == 0) {
                                  iVar1 = uv_tty_reset_mode();
                                  if (iVar1 == 0) {
                                    iVar1 = uv_tty_reset_mode();
                                    if (iVar1 == 0) {
                                      if (*piVar7 == 0) {
                                        uv_close(&tty_in,0);
                                        uv_close(&tty_out,0);
                                        uv_run(uVar4,0);
                                        puVar6 = (uv_loop_t *)uv_default_loop();
                                        close_loop(puVar6);
                                        uVar4 = uv_default_loop();
                                        iVar1 = uv_loop_close(uVar4);
                                        if (iVar1 == 0) {
                                          return 0;
                                        }
                                        pcVar9 = "0 == uv_loop_close(uv_default_loop())";
                                        uStack_2b0 = 0x94;
                                      }
                                      else {
                                        pcVar9 = "0 == errno";
                                        uStack_2b0 = 0x8b;
                                      }
                                    }
                                    else {
                                      pcVar9 = "0 == uv_tty_reset_mode()";
                                      uStack_2b0 = 0x8a;
                                    }
                                  }
                                  else {
                                    pcVar9 = "0 == uv_tty_reset_mode()";
                                    uStack_2b0 = 0x89;
                                  }
                                }
                                else {
                                  pcVar9 = "0 == uv_tty_reset_mode()";
                                  uStack_2b0 = 0x88;
                                }
                              }
                              else {
                                pcVar9 = "r == 0";
                                uStack_2b0 = 0x84;
                              }
                            }
                            else {
                              pcVar9 = "r == 0";
                              uStack_2b0 = 0x80;
                            }
                          }
                        }
                        else {
                          pcVar9 = "r == 0";
                          uStack_2b0 = 0x6c;
                        }
                      }
                    }
                    else {
                      pcVar9 = "!uv_is_readable((uv_stream_t*) &tty_out)";
                      uStack_2b0 = 0x68;
                    }
                  }
                  else {
                    pcVar9 = "r == 0";
                    uStack_2b0 = 0x67;
                  }
                }
                else {
                  pcVar9 = "!uv_is_writable((uv_stream_t*) &tty_in)";
                  uStack_2b0 = 100;
                }
              }
            }
            else {
              pcVar9 = "r == 0";
              uStack_2b0 = 0x62;
            }
          }
          else {
            pcVar9 = "UV_TTY == uv_guess_handle(ttyout_fd)";
            uStack_2b0 = 0x5f;
          }
        }
        else {
          pcVar9 = "UV_TTY == uv_guess_handle(ttyin_fd)";
          uStack_2b0 = 0x5e;
        }
      }
      else {
        pcVar9 = "UV_UNKNOWN_HANDLE == uv_guess_handle(-1)";
        uStack_2b0 = 0x5c;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,uStack_2b0,pcVar9);
      abort();
    }
    pcVar9 = "Cannot open /dev/tty as write-only: %s\n";
  }
  __stream = _stderr;
  piVar7 = __errno_location();
  pcVar8 = strerror(*piVar7);
  fprintf(__stream,pcVar9,pcVar8);
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  int ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  HANDLE handle;
  handle = CreateFileA("conin$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyin_fd = _open_osfhandle((intptr_t) handle, 0);

  handle = CreateFileA("conout$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyout_fd = _open_osfhandle((intptr_t) handle, 0);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }
#endif

  ASSERT(ttyin_fd >= 0);
  ASSERT(ttyout_fd >= 0);

  ASSERT(UV_UNKNOWN_HANDLE == uv_guess_handle(-1));

  ASSERT(UV_TTY == uv_guess_handle(ttyin_fd));
  ASSERT(UV_TTY == uv_guess_handle(ttyout_fd));

  r = uv_tty_init(uv_default_loop(), &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT(r == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(uv_default_loop(), &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT(r == 0);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT(r == 0);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY();
    return TEST_SKIP;
  }

  /*
   * Is it a safe assumption that most people have terminals larger than
   * 10x10?
   */
  ASSERT(width > 10);
  ASSERT(height > 10);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT(r == 0);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT(r == 0);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}